

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall diligent_spirv_cross::CompilerGLSL::reorder_type_alias(CompilerGLSL *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  TypedID *pTVar4;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar5;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar6;
  TypedID *pTVar7;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *__cont;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar8;
  byte local_a9;
  TypedID<(diligent_spirv_cross::Types)0> *alt_master_itr;
  TypedID<(diligent_spirv_cross::Types)0> *alt_alias_itr;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *joined_types;
  TypedID *local_50;
  TypedID<(diligent_spirv_cross::Types)0> *master_itr;
  SPIRType *local_40;
  SPIRType *type;
  TypedID *local_28;
  TypedID<(diligent_spirv_cross::Types)0> *alias_itr;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *type_ids;
  LoopLock loop_lock;
  CompilerGLSL *this_local;
  
  loop_lock.lock = (uint32_t *)this;
  ParsedIR::create_loop_hard_lock((ParsedIR *)&type_ids);
  alias_itr = (TypedID<(diligent_spirv_cross::Types)0> *)
              ((this->super_Compiler).ir.ids_for_type + 1);
  local_28 = (TypedID *)
             ::std::
             begin<diligent_spirv_cross::SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,8ul>>
                       ((SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>
                         *)alias_itr);
  do {
    pTVar7 = local_28;
    pTVar4 = (TypedID *)
             ::std::
             end<diligent_spirv_cross::SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,8ul>>
                       ((SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>
                         *)alias_itr);
    if (pTVar7 == pTVar4) {
      ParsedIR::LoopLock::~LoopLock((LoopLock *)&type_ids);
      return;
    }
    uVar2 = TypedID::operator_cast_to_unsigned_int(local_28);
    local_40 = Compiler::get<diligent_spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_40->type_alias);
    TypedID<(diligent_spirv_cross::Types)1>::TypedID
              ((TypedID<(diligent_spirv_cross::Types)1> *)((long)&master_itr + 4),0);
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&master_itr + 4));
    local_a9 = 0;
    if (uVar2 != uVar3) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_40->type_alias);
      bVar1 = Compiler::has_extended_decoration
                        (&this->super_Compiler,uVar2,SPIRVCrossDecorationBufferBlockRepacked);
      local_a9 = bVar1 ^ 0xff;
    }
    if ((local_a9 & 1) != 0) {
      pTVar5 = ::std::
               begin<diligent_spirv_cross::SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,8ul>>
                         ((SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>
                           *)alias_itr);
      pTVar6 = ::std::
               end<diligent_spirv_cross::SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,8ul>>
                         ((SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>
                           *)alias_itr);
      TypedID<(diligent_spirv_cross::Types)0>::TypedID<(diligent_spirv_cross::Types)1>
                ((TypedID<(diligent_spirv_cross::Types)0> *)((long)&joined_types + 4),
                 &local_40->type_alias);
      pTVar7 = (TypedID *)
               ::std::
               find<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>*,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>>
                         (pTVar5,pTVar6,
                          (TypedID<(diligent_spirv_cross::Types)0> *)((long)&joined_types + 4));
      local_50 = pTVar7;
      pTVar4 = (TypedID *)
               ::std::
               end<diligent_spirv_cross::SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,8ul>>
                         ((SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>
                           *)alias_itr);
      if (pTVar7 == pTVar4) {
        __assert_fail("master_itr != end(type_ids)",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_glsl.cpp"
                      ,0x48ba,"void diligent_spirv_cross::CompilerGLSL::reorder_type_alias()");
      }
      if (local_28 < local_50) {
        __cont = &(this->super_Compiler).ir.ids_for_constant_undef_or_type;
        pTVar5 = ::std::
                 begin<diligent_spirv_cross::SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,8ul>>
                           (__cont);
        pTVar6 = ::std::
                 end<diligent_spirv_cross::SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,8ul>>
                           (__cont);
        pTVar5 = ::std::
                 find<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>*,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>>
                           (pTVar5,pTVar6,(TypedID<(diligent_spirv_cross::Types)0> *)local_28);
        pTVar6 = ::std::
                 begin<diligent_spirv_cross::SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,8ul>>
                           (__cont);
        pTVar8 = ::std::
                 end<diligent_spirv_cross::SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,8ul>>
                           (__cont);
        pTVar6 = ::std::
                 find<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>*,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>>
                           (pTVar6,pTVar8,(TypedID<(diligent_spirv_cross::Types)0> *)local_50);
        pTVar8 = ::std::
                 end<diligent_spirv_cross::SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,8ul>>
                           (__cont);
        if (pTVar5 == pTVar8) {
          __assert_fail("alt_alias_itr != end(joined_types)",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_glsl.cpp"
                        ,0x48c2,"void diligent_spirv_cross::CompilerGLSL::reorder_type_alias()");
        }
        pTVar8 = ::std::
                 end<diligent_spirv_cross::SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,8ul>>
                           (__cont);
        if (pTVar6 == pTVar8) {
          __assert_fail("alt_master_itr != end(joined_types)",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_glsl.cpp"
                        ,0x48c3,"void diligent_spirv_cross::CompilerGLSL::reorder_type_alias()");
        }
        ::std::swap<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>>
                  ((TypedID<(diligent_spirv_cross::Types)0> *)local_28,
                   (TypedID<(diligent_spirv_cross::Types)0> *)local_50);
        ::std::swap<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>>(pTVar5,pTVar6);
      }
    }
    local_28 = local_28 + 4;
  } while( true );
}

Assistant:

void CompilerGLSL::reorder_type_alias()
{
	// Reorder declaration of types so that the master of the type alias is always emitted first.
	// We need this in case a type B depends on type A (A must come before in the vector), but A is an alias of a type Abuffer, which
	// means declaration of A doesn't happen (yet), and order would be B, ABuffer and not ABuffer, B. Fix this up here.
	auto loop_lock = ir.create_loop_hard_lock();

	auto &type_ids = ir.ids_for_type[TypeType];
	for (auto alias_itr = begin(type_ids); alias_itr != end(type_ids); ++alias_itr)
	{
		auto &type = get<SPIRType>(*alias_itr);
		if (type.type_alias != TypeID(0) &&
		    !has_extended_decoration(type.type_alias, SPIRVCrossDecorationBufferBlockRepacked))
		{
			// We will skip declaring this type, so make sure the type_alias type comes before.
			auto master_itr = find(begin(type_ids), end(type_ids), ID(type.type_alias));
			assert(master_itr != end(type_ids));

			if (alias_itr < master_itr)
			{
				// Must also swap the type order for the constant-type joined array.
				auto &joined_types = ir.ids_for_constant_undef_or_type;
				auto alt_alias_itr = find(begin(joined_types), end(joined_types), *alias_itr);
				auto alt_master_itr = find(begin(joined_types), end(joined_types), *master_itr);
				assert(alt_alias_itr != end(joined_types));
				assert(alt_master_itr != end(joined_types));

				swap(*alias_itr, *master_itr);
				swap(*alt_alias_itr, *alt_master_itr);
			}
		}
	}
}